

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall
ktx::ValidationContext::validateKTXmetalPixelFormat
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  int iVar1;
  char *__s;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  ulong uVar2;
  string_view fmt;
  format_args args;
  uint32_t local_6c;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  size_type local_40;
  size_type local_38;
  undefined8 uStack_30;
  ulong local_28 [2];
  
  this->foundKTXmetalPixelFormat = true;
  uVar2 = (ulong)(this->header).vkFormat;
  local_6c = size;
  if (uVar2 != 0) {
    __s = (char *)vkFormatString(uVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,__s,(allocator<char> *)local_28);
    iVar1 = std::__cxx11::string::compare((char *)&local_48);
    if (iVar1 == 0) {
      fmt.size_ = 2;
      fmt.data_ = (char *)0xa;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)local_28;
      local_28[0] = uVar2;
      ::fmt::v10::vformat_abi_cxx11_(&local_68,(v10 *)0x20aba6,fmt,args);
      if (local_48 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_38) {
        operator_delete(local_48,local_38 + 1);
      }
    }
    else {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      if (local_48 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&local_38) {
        local_68.field_2._8_8_ = uStack_30;
      }
      else {
        local_68._M_dataplus._M_p = (pointer)local_48;
      }
      local_68.field_2._M_allocated_capacity = local_38;
      local_68._M_string_length = local_40;
    }
    error<std::__cxx11::string>(this,&Metadata::KTXmetalPixelFormatWithVkFormat,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (size != 4) {
    error<unsigned_int&>(this,&Metadata::KTXmetalPixelFormatInvalidSize,&local_6c);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXmetalPixelFormat(const uint8_t* data, uint32_t size) {
    (void) data;
    foundKTXmetalPixelFormat = true;

    if (header.vkFormat != VK_FORMAT_UNDEFINED)
        error(Metadata::KTXmetalPixelFormatWithVkFormat, toString(VkFormat(header.vkFormat)));

    if (size != 4)
        error(Metadata::KTXmetalPixelFormatInvalidSize, size);
}